

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_trunc.cpp
# Opt level: O0

timestamp_t
duckdb::DateTrunc::MinuteOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
          (timestamp_t input)

{
  dtime_t dVar1;
  int64_t iVar2;
  timestamp_t in_RDI;
  dtime_t time;
  date_t date;
  int32_t micros;
  int32_t sec;
  int32_t min;
  int32_t hour;
  dtime_t local_30;
  date_t local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14 [5];
  
  duckdb::Timestamp::Convert(in_RDI,&local_24,&local_30);
  duckdb::Time::Convert(local_30,local_14,&local_18,&local_1c,&local_20);
  dVar1.micros = duckdb::Time::FromTime(local_14[0],local_18,0,0);
  iVar2 = duckdb::Timestamp::FromDatetime(local_24,dVar1);
  return (timestamp_t)iVar2;
}

Assistant:

static inline TR Operation(TA input) {
			int32_t hour, min, sec, micros;
			date_t date;
			dtime_t time;
			Timestamp::Convert(input, date, time);
			Time::Convert(time, hour, min, sec, micros);
			return Timestamp::FromDatetime(date, Time::FromTime(hour, min, 0, 0));
		}